

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O3

void Psr_ManBuildNtk(Bac_Ntk_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap,
                    Vec_Int_t *vBoxes)

{
  Bac_ObjType_t Type;
  int *piVar1;
  Bac_Man_t *pBVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  Bac_Ntk_t *pBVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  Vec_Int_t *pVVar19;
  uint local_84;
  
  if ((pNtk->vInouts).nSize != 0) {
    __assert_fail("Psr_NtkPioNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                  ,0xa2,
                  "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Psr_ManRemapBoxes(pNew->pDesign,vDes,pNtk,vMap);
  iVar3 = (pNew->vType).nCap;
  lVar11 = (long)iVar3;
  if (lVar11 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
  }
  if ((pNew->vName).nCap < iVar3) {
    piVar5 = (pNew->vName).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(lVar11 * 4);
    }
    else {
      piVar5 = (int *)realloc(piVar5,lVar11 * 4);
    }
    (pNew->vName).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNew->vName).nCap = iVar3;
  }
  if (0 < iVar3) {
    memset((pNew->vName).pArray,0,lVar11 << 2);
  }
  (pNew->vName).nSize = iVar3;
  uVar12 = (pNtk->vInputs).nSize;
  uVar6 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar16) goto LAB_003bee78;
      uVar12 = (pNtk->vInputs).pArray[uVar16];
      uVar6 = (ulong)uVar12;
      if (uVar6 == 0) break;
      if (((int)uVar12 < 0) || (vMap->nSize <= (int)uVar12)) goto LAB_003bee78;
      if (vMap->pArray[uVar6] != 0xffffffff) {
        printf("Primary inputs %d and %d have the same name.\n",(ulong)(uint)vMap->pArray[uVar6],
               uVar16 & 0xffffffff);
      }
      iVar3 = Bac_ObjAlloc(pNew,BAC_OBJ_PI,-1);
      Bac_ObjSetName(pNew,iVar3,uVar12 * 4);
      if (vMap->nSize <= (int)uVar12) goto LAB_003bef13;
      vMap->pArray[uVar6] = iVar3;
      uVar16 = uVar16 + 1;
      uVar6 = (ulong)(pNtk->vInputs).nSize;
    } while ((long)uVar16 < (long)uVar6);
  }
  vBoxes->nSize = 0;
  if (0 < (pNtk->vObjs).nSize) {
    lVar11 = 0;
    do {
      piVar5 = (pNtk->vObjs).pArray;
      iVar3 = piVar5[lVar11];
      if (((long)iVar3 < 0) || (uVar12 = (pNtk->vBoxes).nSize, (int)uVar12 <= iVar3))
      goto LAB_003bee78;
      piVar1 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar1[iVar3] - 2;
      uVar4 = piVar5[lVar11];
      lVar10 = (long)(int)uVar4;
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((lVar10 < -3) || (uVar12 <= uVar4 + 3)) goto LAB_003bef8f;
      Psr_BoxSignals_V._8_8_ = piVar1 + (uVar4 + 3);
      if ((pNtk->vObjs).nSize <= lVar11) goto LAB_003bee78;
      if (*(int *)Psr_BoxSignals_V._8_8_ == 0) {
        if (((int)uVar4 < -1) || (uVar12 <= uVar4)) goto LAB_003bee78;
        Type = piVar1[lVar10 + 1];
        if (5 < piVar1[lVar10]) {
          uVar12 = piVar1[lVar10] - 2U >> 1;
          do {
            uVar12 = uVar12 - 1;
            Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
          } while (1 < uVar12);
        }
        uVar12 = Bac_ObjAlloc(pNew,Type,-1);
        Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
        if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) {
LAB_003befcd:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        uVar4 = *(uint *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4);
        if ((pNtk->field_0x4 & 2) == 0) {
          if ((int)uVar4 < 0) goto LAB_003bee78;
        }
        else {
          if ((int)uVar4 < 0) {
LAB_003bef51:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x13e,"int Abc_Lit2Att2(int)");
          }
          if ((uVar4 & 3) != 0) {
LAB_003bef32:
            __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrs.h"
                          ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
          }
          uVar4 = uVar4 >> 2;
        }
        if (vMap->nSize <= (int)uVar4) goto LAB_003bee78;
        uVar6 = (ulong)uVar4;
        if (vMap->pArray[uVar6] != -1) {
          pcVar7 = "Node output name %d is already driven.\n";
LAB_003be4b4:
          printf(pcVar7,(ulong)uVar4);
        }
LAB_003be4be:
        if (((int)uVar12 < 0) || ((pNew->vType).nSize <= (int)uVar12)) {
LAB_003bee97:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if (((byte)(pNew->vType).pArray[uVar12] >> 1) - 0x49 < 0xffffffbc) {
LAB_003bef70:
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
        }
        Bac_ObjSetName(pNew,uVar12 + 1,uVar4 * 4);
        if (vMap->nSize <= (int)uVar4) goto LAB_003bef13;
        vMap->pArray[uVar6] = uVar12 + 1;
      }
      else {
        if ((int)uVar4 < -1) goto LAB_003bee78;
        iVar17 = piVar1[lVar10 + 1];
        if ((((long)iVar17 < 1) || (vDes->nSize < iVar17)) ||
           (pvVar13 = vDes->pArray[(long)iVar17 + -1], pvVar13 == (void *)0x0)) {
          if (5 < piVar1[iVar3]) {
            uVar12 = (uint)Psr_BoxSignals_V._0_4_ >> 1;
            do {
              uVar12 = uVar12 - 1;
              Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
            } while (1 < uVar12);
          }
          uVar12 = Bac_ObjAlloc(pNew,BAC_BOX_GATE,iVar17);
          Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
          if (((lVar11 < (pNtk->vObjs).nSize) && (iVar3 = (pNtk->vObjs).pArray[lVar11], -3 < iVar3))
             && (uVar4 = iVar3 + 2, (int)uVar4 < (pNtk->vBoxes).nSize)) {
            Bac_ObjSetName(pNew,uVar12,(pNtk->vBoxes).pArray[uVar4] << 2);
            if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) goto LAB_003befcd;
            uVar4 = *(uint *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4);
            if ((pNtk->field_0x4 & 2) == 0) {
              if ((int)uVar4 < 0) goto LAB_003bee78;
            }
            else {
              if ((int)uVar4 < 0) goto LAB_003bef51;
              if ((uVar4 & 3) != 0) goto LAB_003bef32;
              uVar4 = uVar4 >> 2;
            }
            if ((int)uVar4 < vMap->nSize) {
              uVar6 = (ulong)uVar4;
              if (vMap->pArray[uVar6] != -1) {
                pcVar7 = "Box output name %d is already driven.\n";
                goto LAB_003be4b4;
              }
              goto LAB_003be4be;
            }
          }
          goto LAB_003bee78;
        }
        iVar3 = *(int *)((long)pvVar13 + 0x44);
        if (0 < *(int *)((long)pvVar13 + 0x34)) {
          uVar12 = *(int *)((long)pvVar13 + 0x34) + 1;
          do {
            Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        uVar12 = Bac_ObjAlloc(pNew,BAC_OBJ_BOX,iVar17);
        if (0 < iVar3) {
          do {
            Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        if ((((((pNtk->vObjs).nSize <= lVar11) || (iVar3 = (pNtk->vObjs).pArray[lVar11], iVar3 < -2)
              ) || (uVar4 = iVar3 + 2, (pNtk->vBoxes).nSize <= (int)uVar4)) ||
            ((Bac_ObjSetName(pNew,uVar12,(pNtk->vBoxes).pArray[uVar4] << 2),
             (pNtk->vObjs).nSize <= lVar11 || (iVar3 = (pNtk->vObjs).pArray[lVar11], iVar3 < -1))))
           || (uVar4 = iVar3 + 1, (pNtk->vBoxes).nSize <= (int)uVar4)) goto LAB_003bee78;
        pBVar2 = pNew->pDesign;
        iVar3 = (pNtk->vBoxes).pArray[uVar4];
        if (((long)iVar3 < 1) || (pBVar2->nNtks < iVar3)) {
          pBVar9 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar9 = pBVar2->pNtks + iVar3;
        }
        iVar3 = (int)((ulong)((long)pNew - (long)pBVar2->pNtks) >> 4) * -0x3b13b13b;
        if ((iVar3 < 1) || (pBVar2->nNtks < iVar3)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (pBVar9->iBoxNtk != -1) {
          __assert_fail("p->iBoxNtk == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
        }
        pBVar9->iBoxNtk = iVar3;
        pBVar9->iBoxObj = uVar12;
        if (0 < (int)Psr_BoxSignals_V._4_4_) {
          lVar10 = Psr_BoxSignals_V._8_8_;
          lVar15 = 1;
          iVar3 = Psr_BoxSignals_V._4_4_;
          do {
            iVar17 = *(int *)(lVar10 + -4 + lVar15 * 4);
            if (*(int *)((long)pvVar13 + 0x34) < iVar17) {
              iVar17 = iVar17 + -1;
              iVar14 = iVar17 - *(int *)((long)pvVar13 + 0x34);
              if (*(int *)((long)pvVar13 + 0x44) <= iVar14) {
                __assert_fail("Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                              ,0xcb,
                              "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              if (iVar3 <= lVar15) goto LAB_003bee78;
              uVar4 = *(uint *)(lVar10 + lVar15 * 4);
              if ((pNtk->field_0x4 & 2) == 0) {
                if ((int)uVar4 < 0) goto LAB_003bee78;
              }
              else {
                if ((int)uVar4 < 0) goto LAB_003bef51;
                if ((uVar4 & 3) != 0) goto LAB_003bef32;
                uVar4 = uVar4 >> 2;
              }
              if (vMap->nSize <= (int)uVar4) goto LAB_003bee78;
              if (vMap->pArray[uVar4] != -1) {
                printf("Box output name %d is already driven.\n",(ulong)uVar4);
                iVar14 = iVar17 - *(int *)((long)pvVar13 + 0x34);
              }
              if (((int)uVar12 < 0) || ((pNew->vType).nSize <= (int)uVar12)) goto LAB_003bee97;
              if (((byte)(pNew->vType).pArray[uVar12] >> 1) - 0x49 < 0xffffffbc) goto LAB_003bef70;
              iVar14 = iVar14 + uVar12 + 1;
              Bac_ObjSetName(pNew,iVar14,uVar4 * 4);
              lVar10 = Psr_BoxSignals_V._8_8_;
              if (vMap->nSize <= (int)uVar4) goto LAB_003bef13;
              vMap->pArray[uVar4] = iVar14;
              iVar3 = Psr_BoxSignals_V._4_4_;
            }
            iVar17 = (int)lVar15;
            lVar15 = lVar15 + 2;
          } while (iVar17 + 1 < iVar3);
        }
      }
      Vec_IntPush(vBoxes,uVar12);
      lVar11 = lVar11 + 1;
      iVar3 = (pNtk->vObjs).nSize;
    } while (lVar11 < iVar3);
    if (0 < iVar3) {
      pVVar19 = &pNew->vFanin;
      uVar12 = 0xffffffff;
      lVar11 = 0;
      local_84 = 0;
      do {
        piVar5 = (pNtk->vObjs).pArray;
        iVar3 = piVar5[lVar11];
        if (((long)iVar3 < 0) || (uVar4 = (pNtk->vBoxes).nSize, (int)uVar4 <= iVar3))
        goto LAB_003bee78;
        piVar1 = (pNtk->vBoxes).pArray;
        iVar3 = piVar1[iVar3];
        Psr_BoxSignals_V._0_4_ = iVar3 - 2;
        uVar6 = (ulong)(uint)Psr_BoxSignals_V._0_4_;
        iVar17 = piVar5[lVar11];
        Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
        if (((long)iVar17 < -3) || (uVar4 <= iVar17 + 3U)) {
LAB_003bef8f:
          Psr_BoxSignals_V._0_4_ = Psr_BoxSignals_V._4_4_;
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = piVar1 + (iVar17 + 3U);
        Psr_BoxSignals_V._8_8_ = piVar5;
        if ((pNtk->vObjs).nSize <= lVar11) goto LAB_003bee78;
        if (*piVar5 == 0) {
          if (vBoxes->nSize <= lVar11) goto LAB_003bee78;
          if (4 < iVar3) {
            uVar4 = vBoxes->pArray[lVar11];
            lVar10 = (long)(int)uVar4;
            uVar16 = 1;
            do {
              lVar10 = lVar10 + -1;
              if ((uVar6 & 0xffffffff) <= uVar16) goto LAB_003bee78;
              uVar18 = *(uint *)(Psr_BoxSignals_V._8_8_ + uVar16 * 4);
              if ((pNtk->field_0x4 & 2) != 0) {
                if ((int)uVar18 < 0) goto LAB_003bef51;
                if ((uVar18 & 3) != 0) goto LAB_003bef32;
                uVar18 = uVar18 >> 2;
              }
              if (((int)uVar4 < 0) || ((pNew->vType).nSize <= (int)uVar4)) goto LAB_003bee97;
              if (((byte)(pNew->vType).pArray[uVar4] >> 1) - 0x49 < 0xffffffbc) goto LAB_003beed5;
              if (((int)uVar18 < 0) || (iVar3 = vMap->nSize, iVar3 <= (int)uVar18))
              goto LAB_003bee78;
              iVar17 = vMap->pArray[uVar18];
              if (iVar17 == -1) {
                iVar17 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
                Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
                if (vMap->nSize <= (int)uVar18) goto LAB_003bef13;
                iVar17 = iVar17 + 1;
                vMap->pArray[uVar18] = iVar17;
                if (uVar12 == 0xffffffff) {
                  uVar12 = uVar18;
                }
                local_84 = local_84 + 1;
                iVar3 = vMap->nSize;
              }
              if (iVar3 <= (int)uVar18) goto LAB_003bee78;
              if ((lVar10 < 0) || ((pNew->vType).nSize <= lVar10)) goto LAB_003bee97;
              if (((pNew->vType).pArray[lVar10] & 0xfcU) != 4) goto LAB_003beef4;
              if ((pNew->vFanin).nSize <= lVar10) goto LAB_003bee78;
              if ((pNew->vFanin).pArray[lVar10] != -1) goto LAB_003beeb6;
              Vec_IntSetEntry(pVVar19,(int)lVar10,iVar17);
              uVar6 = (ulong)(int)Psr_BoxSignals_V._4_4_;
              lVar15 = uVar16 + 1;
              uVar16 = uVar16 + 2;
            } while (lVar15 < (long)(uVar6 - 2));
          }
        }
        else {
          if (iVar17 < -1) goto LAB_003bee78;
          iVar17 = piVar1[(long)iVar17 + 1];
          if (((long)iVar17 < 1) || (vDes->nSize < iVar17)) {
            pvVar13 = (void *)0x0;
          }
          else {
            pvVar13 = vDes->pArray[(long)iVar17 + -1];
          }
          if (vBoxes->nSize <= lVar11) goto LAB_003bee78;
          uVar4 = vBoxes->pArray[lVar11];
          if (pvVar13 == (void *)0x0) {
            if (4 < iVar3) {
              lVar10 = (long)(int)uVar4;
              uVar16 = 1;
              do {
                lVar10 = lVar10 + -1;
                if ((uVar6 & 0xffffffff) <= uVar16) goto LAB_003bee78;
                uVar18 = *(uint *)(Psr_BoxSignals_V._8_8_ + uVar16 * 4);
                if ((pNtk->field_0x4 & 2) != 0) {
                  if ((int)uVar18 < 0) goto LAB_003bef51;
                  if ((uVar18 & 3) != 0) goto LAB_003bef32;
                  uVar18 = uVar18 >> 2;
                }
                if (((int)uVar4 < 0) || ((pNew->vType).nSize <= (int)uVar4)) goto LAB_003bee97;
                if (((byte)(pNew->vType).pArray[uVar4] >> 1) - 0x49 < 0xffffffbc) goto LAB_003beed5;
                if (((int)uVar18 < 0) || (iVar3 = vMap->nSize, iVar3 <= (int)uVar18))
                goto LAB_003bee78;
                iVar17 = vMap->pArray[uVar18];
                if (iVar17 == -1) {
                  iVar17 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
                  Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
                  if (vMap->nSize <= (int)uVar18) goto LAB_003bef13;
                  iVar17 = iVar17 + 1;
                  vMap->pArray[uVar18] = iVar17;
                  if (uVar12 == 0xffffffff) {
                    uVar12 = uVar18;
                  }
                  local_84 = local_84 + 1;
                  iVar3 = vMap->nSize;
                }
                if (iVar3 <= (int)uVar18) goto LAB_003bee78;
                if ((lVar10 < 0) || ((pNew->vType).nSize <= lVar10)) goto LAB_003bee97;
                if (((pNew->vType).pArray[lVar10] & 0xfcU) != 4) goto LAB_003beef4;
                if ((pNew->vFanin).nSize <= lVar10) goto LAB_003bee78;
                if ((pNew->vFanin).pArray[lVar10] != -1) goto LAB_003beeb6;
                Vec_IntSetEntry(pVVar19,(int)lVar10,iVar17);
                uVar6 = (ulong)(int)Psr_BoxSignals_V._4_4_;
                lVar15 = uVar16 + 1;
                uVar16 = uVar16 + 2;
              } while (lVar15 < (long)(uVar6 - 2));
            }
          }
          else if (2 < iVar3) {
            lVar10 = 1;
            do {
              iVar3 = piVar5[lVar10 + -1];
              if (iVar3 <= *(int *)((long)pvVar13 + 0x34)) {
                if ((int)uVar6 <= lVar10) goto LAB_003bee78;
                uVar18 = piVar5[lVar10];
                if ((pNtk->field_0x4 & 2) != 0) {
                  if ((int)uVar18 < 0) goto LAB_003bef51;
                  if ((uVar18 & 3) != 0) goto LAB_003bef32;
                  uVar18 = uVar18 >> 2;
                }
                if (((int)uVar4 < 0) || ((pNew->vType).nSize <= (int)uVar4)) goto LAB_003bee97;
                if (((byte)(pNew->vType).pArray[uVar4] >> 1) - 0x49 < 0xffffffbc) {
LAB_003beed5:
                  __assert_fail("Bac_ObjIsBox(p, b)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                                ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
                }
                if (((int)uVar18 < 0) || (iVar17 = vMap->nSize, iVar17 <= (int)uVar18))
                goto LAB_003bee78;
                iVar14 = vMap->pArray[uVar18];
                if (iVar14 == -1) {
                  iVar14 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
                  Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
                  if (vMap->nSize <= (int)uVar18) goto LAB_003bef13;
                  iVar14 = iVar14 + 1;
                  vMap->pArray[uVar18] = iVar14;
                  if (uVar12 == 0xffffffff) {
                    uVar12 = uVar18;
                  }
                  local_84 = local_84 + 1;
                  iVar17 = vMap->nSize;
                }
                if (iVar17 <= (int)uVar18) goto LAB_003bee78;
                uVar18 = uVar4 - iVar3;
                if (((int)uVar18 < 0) || ((pNew->vType).nSize <= (int)uVar18)) goto LAB_003bee97;
                if (((pNew->vType).pArray[uVar18] & 0xfcU) != 4) {
LAB_003beef4:
                  __assert_fail("Bac_ObjIsCo(p, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                                ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
                }
                if ((pNew->vFanin).nSize <= (int)uVar18) goto LAB_003bee78;
                if ((pNew->vFanin).pArray[uVar18] != -1) {
LAB_003beeb6:
                  __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                                ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
                }
                Vec_IntSetEntry(pVVar19,uVar18,iVar14);
                uVar6 = (ulong)(uint)Psr_BoxSignals_V._4_4_;
                piVar5 = (int *)Psr_BoxSignals_V._8_8_;
              }
              iVar3 = (int)lVar10;
              lVar10 = lVar10 + 2;
            } while (iVar3 + 1 < (int)uVar6);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (pNtk->vObjs).nSize);
      goto LAB_003becc9;
    }
  }
  local_84 = 0;
  uVar12 = 0xffffffff;
LAB_003becc9:
  uVar4 = (pNtk->vOutputs).nSize;
  uVar6 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    lVar11 = 0;
    do {
      lVar10 = (long)(int)uVar6;
      if (lVar10 <= lVar11) goto LAB_003bee78;
      uVar4 = (pNtk->vOutputs).pArray[lVar11];
      uVar16 = (ulong)uVar4;
      if (uVar16 == 0) break;
      if (((int)uVar4 < 0) || (vMap->nSize <= (int)uVar4)) goto LAB_003bee78;
      if (vMap->pArray[uVar16] == -1) {
        iVar3 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
        Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
        if (vMap->nSize <= (int)uVar4) {
LAB_003bef13:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar16] = iVar3 + 1;
        if (uVar12 != 0xffffffff) {
          uVar4 = uVar12;
        }
        local_84 = local_84 + 1;
        uVar12 = (pNtk->vOutputs).nSize;
        uVar6 = (ulong)uVar12;
        lVar10 = (long)(int)uVar12;
        uVar12 = uVar4;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < lVar10);
    if (0 < (int)uVar6) {
      lVar11 = 0;
LAB_003bed93:
      if ((int)uVar6 <= lVar11) {
LAB_003bee78:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = (pNtk->vOutputs).pArray[lVar11];
      if ((ulong)uVar4 != 0) {
        if (((int)uVar4 < 0) || (vMap->nSize <= (int)uVar4)) goto LAB_003bee78;
        Bac_ObjAlloc(pNew,BAC_OBJ_PO,vMap->pArray[uVar4]);
        lVar11 = lVar11 + 1;
        uVar6 = (ulong)(pNtk->vOutputs).nSize;
        if (lVar11 < (long)uVar6) goto LAB_003bed93;
      }
    }
  }
  if (local_84 != 0) {
    pcVar7 = Abc_NamStr(pNtk->pStrs,pNtk->iModuleName);
    pcVar8 = Abc_NamStr(pNtk->pStrs,uVar12);
    printf("Module %s has %d non-driven nets (for example, %s).\n",pcVar7,(ulong)local_84,pcVar8);
  }
  Psr_ManCleanMap(pNtk,vMap);
  if (0 < (pNtk->vOrder).nSize) {
    pVVar19 = &pNew->vInfo;
    lVar11 = 0;
    do {
      Vec_IntPush(pVVar19,(pNtk->vOrder).pArray[lVar11]);
      Vec_IntPush(pVVar19,-1);
      Vec_IntPush(pVVar19,-1);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pNtk->vOrder).nSize);
  }
  return;
}

Assistant:

void Psr_ManBuildNtk( Bac_Ntk_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap, Vec_Int_t * vBoxes )
{
    Psr_Ntk_t * pNtkBox; Vec_Int_t * vSigs; int iBox;
    int i, Index, NameId, iObj, iConst0, iTerm;
    int iNonDriven = -1, nNonDriven = 0;
    assert( Psr_NtkPioNum(pNtk) == 0 );
    Psr_ManRemapBoxes( pNew->pDesign, vDes, pNtk, vMap );
    Bac_NtkStartNames( pNew );
    // create primary inputs 
    Psr_NtkForEachPi( pNtk, NameId, i )
    {
        if ( Vec_IntEntry(vMap, NameId) != -1 )
            printf( "Primary inputs %d and %d have the same name.\n", Vec_IntEntry(vMap, NameId), i );
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntWriteEntry( vMap, NameId, iObj );
    }
    // create box outputs
    Vec_IntClear( vBoxes );
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            if ( pNtkBox == NULL )
            {
                iObj = Bac_BoxAlloc( pNew, BAC_BOX_GATE, Vec_IntSize(vSigs)/2-1, 1, Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                // consider box output 
                NameId = Vec_IntEntryLast( vSigs );
                NameId = Psr_NtkSigName( pNtk, NameId );
                if ( Vec_IntEntry(vMap, NameId) != -1 )
                    printf( "Box output name %d is already driven.\n", NameId );
                iTerm = Bac_BoxBo( pNew, iObj, 0 );
                Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                Vec_IntWriteEntry( vMap, NameId, iTerm );
            }
            else
            {
                iObj = Bac_BoxAlloc( pNew, BAC_OBJ_BOX, Psr_NtkPiNum(pNtkBox), Psr_NtkPoNum(pNtkBox), Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                Bac_NtkSetHost( Bac_ManNtk(pNew->pDesign, Psr_BoxNtk(pNtk, iBox)), Bac_NtkId(pNew), iObj );
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index < Psr_NtkPiNum(pNtkBox) )
                        continue;
                    assert( Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox) );
                    // consider box output 
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    if ( Vec_IntEntry(vMap, NameId) != -1 )
                        printf( "Box output name %d is already driven.\n", NameId );
                    iTerm = Bac_BoxBo( pNew, iObj, Index - Psr_NtkPiNum(pNtkBox) );
                    Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                    Vec_IntWriteEntry( vMap, NameId, iTerm );
                }
            }
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
        else
        {
            iObj = Bac_BoxAlloc( pNew, (Bac_ObjType_t)Psr_BoxNtk(pNtk, iBox), Psr_BoxIONum(pNtk, iBox)-1, 1, -1 );
            // consider box output 
            NameId = Vec_IntEntryLast( vSigs );
            NameId = Psr_NtkSigName( pNtk, NameId );
            if ( Vec_IntEntry(vMap, NameId) != -1 )
                printf( "Node output name %d is already driven.\n", NameId );
            iTerm = Bac_BoxBo( pNew, iObj, 0 );
            Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntWriteEntry( vMap, NameId, iTerm );
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
    // add fanins for box inputs
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            iObj = Vec_IntEntry( vBoxes, iBox );
            if ( pNtkBox == NULL )
            {
                Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
                {
                    i++;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
            else
            {
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index >= Psr_NtkPiNum(pNtkBox) )
                        continue;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, Index );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
        }
        else
        {
            iObj = Vec_IntEntry( vBoxes, iBox );
            Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
            {
                NameId = Vec_IntEntry( vSigs, ++i );
                NameId = Psr_NtkSigName( pNtk, NameId );
                iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                if ( Vec_IntEntry(vMap, NameId) == -1 )
                {
                    iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                    Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                    if ( iNonDriven == -1 )
                        iNonDriven = NameId;
                    nNonDriven++;
                }
                Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
            }
        }
    // add fanins for primary outputs
    Psr_NtkForEachPo( pNtk, NameId, i )
        if ( Vec_IntEntry(vMap, NameId) == -1 )
        {
            iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
            Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
            if ( iNonDriven == -1 )
                iNonDriven = NameId;
            nNonDriven++;
        }
    Psr_NtkForEachPo( pNtk, NameId, i )
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PO, Vec_IntEntry(vMap, NameId) );
    if ( nNonDriven )
        printf( "Module %s has %d non-driven nets (for example, %s).\n", Psr_NtkName(pNtk), nNonDriven, Psr_NtkStr(pNtk, iNonDriven) );
    Psr_ManCleanMap( pNtk, vMap );
    // setup info
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
        Bac_NtkAddInfo( pNew, NameId, -1, -1 );
}